

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::copyAppend
          (QGenericArrayOps<Parser::IncludePath> *this,IncludePath *b,IncludePath *e)

{
  qsizetype *pqVar1;
  IncludePath *pIVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pIVar2 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
      pDVar4 = (b->path).d.d;
      pIVar2[lVar3].path.d.d = pDVar4;
      pIVar2[lVar3].path.d.ptr = (b->path).d.ptr;
      pIVar2[lVar3].path.d.size = (b->path).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pIVar2[lVar3].isFrameworkPath = b->isFrameworkPath;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<Parser::IncludePath>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }